

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O3

Boxed_Value __thiscall
chaiscript::eval::Switch_AST_Node<chaiscript::eval::Tracer<Count_Tracer>_>::eval_internal
          (Switch_AST_Node<chaiscript::eval::Tracer<Count_Tracer>_> *this,Dispatch_State *t_ss)

{
  Dispatch_State *t_e;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  Type_Conversions *pTVar5;
  size_t *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long lVar6;
  ulong uVar7;
  string_view t_name;
  Boxed_Value BVar8;
  array<chaiscript::Boxed_Value,_2UL> p;
  Boxed_Value match_value;
  size_t *local_b8;
  pointer local_b0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a8;
  undefined1 local_a0 [56];
  File_Position local_68;
  undefined1 local_60 [32];
  undefined8 local_38;
  
  local_a0._32_8_ = this;
  chaiscript::detail::Dispatch_Engine::new_scope((Stack_Holder *)in_RDX[1]);
  AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>::eval
            ((AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_> *)(local_a0 + 0x10),
             (Dispatch_State *)
             ((t_ss[2].m_conversions.m_conversions._M_data)->m_mutex)._M_impl._M_rwlock.__align);
  pTVar5 = t_ss[2].m_conversions.m_conversions._M_data;
  if (8 < (ulong)((long)t_ss[2].m_conversions.m_saves._M_data - (long)pTVar5)) {
    local_a0._40_8_ = in_RDX + 2;
    uVar7 = 1;
    bVar3 = false;
    do {
      t_e = *(Dispatch_State **)((long)&(pTVar5->m_mutex)._M_impl._M_rwlock + uVar7 * 8);
      iVar4 = *(int *)&(t_e->m_stack_holder)._M_data;
      if (iVar4 == 0x25) {
        AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>::eval
                  ((AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_> *)(local_60 + 0x10),t_e);
        bVar3 = true;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._24_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._24_8_);
        }
      }
      else if (iVar4 == 0x24) {
        local_b0 = (pointer)local_a0._16_8_;
        local_a8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._24_8_;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._24_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(_Atomic_word *)(local_a0._24_8_ + 8) = *(_Atomic_word *)(local_a0._24_8_ + 8) + 1;
            UNLOCK();
            pTVar5 = t_ss[2].m_conversions.m_conversions._M_data;
          }
          else {
            *(_Atomic_word *)(local_a0._24_8_ + 8) = *(_Atomic_word *)(local_a0._24_8_ + 8) + 1;
          }
        }
        AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>::eval
                  ((AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_> *)local_a0,
                   (Dispatch_State *)
                   **(undefined8 **)
                     (*(long *)((long)&(pTVar5->m_mutex)._M_impl._M_rwlock + uVar7 * 8) + 0x50));
        if (bVar3) {
LAB_004b018c:
          AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>::eval
                    ((AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_> *)
                     &stack0xffffffffffffffc0,
                     *(Dispatch_State **)
                      ((long)&((t_ss[2].m_conversions.m_conversions._M_data)->m_mutex)._M_impl.
                              _M_rwlock + uVar7 * 8));
          bVar3 = true;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38 !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38);
          }
        }
        else {
          local_a0._48_8_ = &local_b0;
          local_68 = (File_Position)((long)local_a0 + 0x10);
          local_b8 = (size_t *)local_a0._40_8_;
          t_name._M_str = (char *)0x2;
          t_name._M_len = *in_RDX;
          chaiscript::detail::Dispatch_Engine::call_function
                    ((Dispatch_Engine *)local_60,t_name,(atomic_uint_fast32_t *)"==",
                     (Function_Params *)&t_ss[3].m_stack_holder,
                     (Type_Conversions_State *)(local_a0 + 0x30));
          bVar3 = boxed_cast<bool>((Boxed_Value *)local_60,(Type_Conversions_State *)0x0);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_);
          }
          if (bVar3) goto LAB_004b018c;
          bVar3 = false;
        }
        lVar6 = 0x20;
        do {
          if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&local_b8 + lVar6) !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&local_b8 + lVar6));
          }
          lVar6 = lVar6 + -0x10;
        } while (lVar6 != 0);
      }
      uVar7 = uVar7 + 1;
      pTVar5 = t_ss[2].m_conversions.m_conversions._M_data;
    } while (uVar7 < (ulong)((long)t_ss[2].m_conversions.m_saves._M_data - (long)pTVar5 >> 3));
  }
  if (void_var()::v == '\0') {
    iVar4 = __cxa_guard_acquire(&void_var()::v);
    if (iVar4 != 0) {
      void_var::v.m_data.
      super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x50);
      (void_var::v.m_data.
       super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count = 1;
      (void_var::v.m_data.
       super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_weak_count = 1;
      (void_var::v.m_data.
       super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0059e870;
      void_var::v.m_data.
      super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           (void_var::v.m_data.
            super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi + 1);
      void_var::v.m_data.
      super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi[1]._vptr__Sp_counted_base = (_func_int **)&void::typeinfo;
      *(undefined **)
       &void_var::v.m_data.
        super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi[1]._M_use_count = &void::typeinfo;
      *(undefined4 *)
       &void_var::v.m_data.
        super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi[2]._vptr__Sp_counted_base = 8;
      void_var::v.m_data.
      super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi[2]._M_use_count = 0;
      void_var::v.m_data.
      super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi[2]._M_weak_count = 0;
      void_var::v.m_data.
      super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi[3]._vptr__Sp_counted_base = (_func_int **)0x0;
      void_var::v.m_data.
      super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi[3]._M_use_count = 0;
      void_var::v.m_data.
      super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi[3]._M_weak_count = 0;
      void_var::v.m_data.
      super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi[4]._vptr__Sp_counted_base = (_func_int **)0x0;
      *(undefined2 *)
       &void_var::v.m_data.
        super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi[4]._M_use_count = 0;
      __cxa_atexit(Boxed_Value::~Boxed_Value,&void_var::v,&__dso_handle);
      __cxa_guard_release(&void_var()::v);
    }
  }
  uVar2 = local_a0._32_8_;
  *(element_type **)local_a0._32_8_ =
       void_var::v.m_data.
       super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  _Var1 = void_var::v.m_data.
          super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_a0._32_8_ + 8) =
       void_var::v.m_data.
       super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  if (_Var1._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (_Var1._M_pi)->_M_use_count = (_Var1._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (_Var1._M_pi)->_M_use_count = (_Var1._M_pi)->_M_use_count + 1;
    }
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._24_8_);
  }
  chaiscript::detail::Dispatch_Engine::pop_scope((Stack_Holder *)in_RDX[1]);
  BVar8.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar8.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)uVar2;
  return (Boxed_Value)
         BVar8.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Boxed_Value eval_internal(const chaiscript::detail::Dispatch_State &t_ss) const override {
        bool breaking = false;
        size_t currentCase = 1;
        bool hasMatched = false;

        chaiscript::eval::detail::Scope_Push_Pop spp(t_ss);

        Boxed_Value match_value(this->children[0]->eval(t_ss));

        while (!breaking && (currentCase < this->children.size())) {
          try {
            if (this->children[currentCase]->identifier == AST_Node_Type::Case) {
              // This is a little odd, but because want to see both the switch and the case simultaneously, I do a downcast here.
              try {
                std::array<Boxed_Value, 2> p{match_value, this->children[currentCase]->children[0]->eval(t_ss)};
                if (hasMatched || boxed_cast<bool>(t_ss->call_function("==", m_loc, Function_Params{p}, t_ss.conversions()))) {
                  this->children[currentCase]->eval(t_ss);
                  hasMatched = true;
                }
              } catch (const exception::bad_boxed_cast &) {
                throw exception::eval_error("Internal error: case guard evaluation not boolean");
              }
            } else if (this->children[currentCase]->identifier == AST_Node_Type::Default) {
              this->children[currentCase]->eval(t_ss);
              hasMatched = true;
            }
          } catch (detail::Break_Loop &) {
            breaking = true;
          }
          ++currentCase;
        }
        return void_var();
      }